

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_ast.h
# Opt level: O1

Ref __thiscall cashew::ValueBuilder::makeCall(ValueBuilder *this,IString target)

{
  char *pcVar1;
  Value *pVVar2;
  Ref RVar3;
  Value *this_00;
  void *pvVar4;
  
  pVVar2 = (Value *)MixedArena::allocSpace((MixedArena *)arena,0x18,8);
  pVVar2->type = Null;
  pVVar2 = cashew::Value::setArray(pVVar2,3);
  pvVar4 = (void *)0x18;
  RVar3.inst = (Value *)MixedArena::allocSpace((MixedArena *)arena,0x18,8);
  (RVar3.inst)->type = Null;
  cashew::Value::free(RVar3.inst,pvVar4);
  (RVar3.inst)->type = String;
  pcVar1 = DAT_010d1600;
  ((RVar3.inst)->field_1).str.str._M_len = CALL;
  ((RVar3.inst)->field_1).str.str._M_str = pcVar1;
  pVVar2 = cashew::Value::push_back(pVVar2,RVar3);
  pvVar4 = (void *)0x18;
  RVar3.inst = (Value *)MixedArena::allocSpace((MixedArena *)arena,0x18,8);
  (RVar3.inst)->type = Null;
  cashew::Value::free(RVar3.inst,pvVar4);
  (RVar3.inst)->type = String;
  ((RVar3.inst)->field_1).arr = (ArrayStorage *)this;
  ((RVar3.inst)->field_1).str.str._M_str = (char *)target.str._M_len;
  pVVar2 = cashew::Value::push_back(pVVar2,RVar3);
  this_00 = (Value *)MixedArena::allocSpace((MixedArena *)arena,0x18,8);
  this_00->type = Null;
  RVar3.inst = cashew::Value::setArray(this_00,0);
  RVar3.inst = cashew::Value::push_back(pVVar2,RVar3);
  return (Ref)RVar3.inst;
}

Assistant:

static Ref makeCall(IString target) {
    Ref ret = &makeRawArray(3)
                 ->push_back(makeRawString(CALL))
                 .push_back(makeName(target))
                 .push_back(makeRawArray());
    return ret;
  }